

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O1

int Abc_CommandInvCheck(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  Vec_Int_t *vInv;
  int iVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  uVar3 = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    uVar3 = uVar3 ^ 1;
  }
  if (iVar1 == -1) {
    p = pAbc->pGia;
    if (p == (Gia_Man_t *)0x0) {
      pcVar4 = "Abc_CommandInvMin(): There is no current design.\n";
    }
    else {
      vInv = pAbc->pAbcWlcInv;
      if (vInv == (Vec_Int_t *)0x0) {
        pcVar4 = "Abc_CommandInvMin(): There is no saved invariant.\n";
      }
      else {
        if ((long)vInv->nSize < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
        }
        if (p->nRegs == vInv->pArray[(long)vInv->nSize + -1]) {
          uVar3 = Pdr_InvCheck(p,vInv,uVar3);
          if (uVar3 == 0) {
            printf("Invariant verification succeeded.    ");
          }
          else {
            if (pAbc->pAbcWlcInv->nSize < 1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            printf("Invariant verification failed for %d clauses (out of %d). ",(ulong)uVar3,
                   (ulong)(uint)*pAbc->pAbcWlcInv->pArray);
          }
          iVar1 = clock_gettime(3,&local_40);
          if (iVar1 < 0) {
            lVar5 = -1;
          }
          else {
            lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
          }
          Abc_Print(1,"%s =","Time");
          Abc_Print(1,"%9.2f sec\n",(double)(lVar5 + lVar2) / 1000000.0);
          return 0;
        }
        pcVar4 = 
        "Abc_CommandInvMin(): The number of flops in the invariant and in GIA should be the same.\n"
        ;
      }
    }
    iVar1 = 0;
    Abc_Print(1,pcVar4);
  }
  else {
    Abc_Print(-2,"usage: inv_check [-vh]\n");
    Abc_Print(-2,"\t         checks that the invariant is indeed an inductive invariant\n");
    Abc_Print(-2,"\t         (AIG representing the design should be in the &-space)\n");
    pcVar4 = "yes";
    if (uVar3 == 0) {
      pcVar4 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_CommandInvCheck( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    abctime clk = Abc_Clock();
    extern int Pdr_InvCheck( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose );
    int c, nFailed, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( 1, "Abc_CommandInvMin(): There is no current design.\n" );
        return 0;
    }
    if ( Wlc_AbcGetInv(pAbc) == NULL )
    {
        Abc_Print( 1, "Abc_CommandInvMin(): There is no saved invariant.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) != Vec_IntEntryLast(Wlc_AbcGetInv(pAbc)) )
    {
        Abc_Print( 1, "Abc_CommandInvMin(): The number of flops in the invariant and in GIA should be the same.\n" );
        return 0;
    }
    nFailed = Pdr_InvCheck( pAbc->pGia, Wlc_AbcGetInv(pAbc), fVerbose );
    if ( nFailed )
        printf( "Invariant verification failed for %d clauses (out of %d). ", nFailed, Vec_IntEntry(Wlc_AbcGetInv(pAbc),0) );
    else
        printf( "Invariant verification succeeded.    " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 0;
usage:
    Abc_Print( -2, "usage: inv_check [-vh]\n" );
    Abc_Print( -2, "\t         checks that the invariant is indeed an inductive invariant\n" );
    Abc_Print( -2, "\t         (AIG representing the design should be in the &-space)\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}